

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O0

void __thiscall
prevector_tests::prevector_tester<8U,_int>::prevector_tester
          (prevector_tester<8U,_int> *this,FastRandomContext *rng)

{
  long lVar1;
  FastRandomContext *in_RDI;
  long in_FS_OFFSET;
  prevector<8U,_int,_unsigned_int,_int> *in_stack_ffffffffffffff88;
  byte *seed;
  FastRandomContext *this_00;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffffb8;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff88);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff88);
  prevector<8U,_int,_unsigned_int,_int>::prevector(in_stack_ffffffffffffff88);
  seed = (this_00->rng).m_buffer._M_elems + 0x18;
  prevector<8U,_int,_unsigned_int,_int>::prevector(in_stack_ffffffffffffff88);
  *(undefined1 *)&(this_00->rng).m_bufleft = 1;
  uint256::uint256((uint256 *)in_stack_ffffffffffffff88);
  RandomMixin<FastRandomContext>::rand256(in_stack_ffffffffffffffb8);
  *(undefined8 *)((long)&in_RDI[1].super_RandomMixin<FastRandomContext>.bitbuf_size + 1) = local_18;
  *(undefined8 *)((long)in_RDI[1].rng.m_aligned.input + 1) = uStack_10;
  *(undefined8 *)((long)&(in_RDI->rng).m_bufleft + 1) = local_28;
  *(undefined8 *)((long)&in_RDI[1].super_RandomMixin<FastRandomContext>.bitbuf + 1) = uStack_20;
  FastRandomContext::Reseed(this_00,(uint256 *)seed);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

prevector_tester(FastRandomContext& rng) {
        rand_seed = rng.rand256();
        rng.Reseed(rand_seed);
    }